

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

shared_ptr<chrono::ChMarker> __thiscall
chrono::ChAssembly::SearchMarker(ChAssembly *this,int markID)

{
  long *plVar1;
  _func_int **pp_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int myID;
  undefined4 in_register_00000034;
  long *plVar3;
  bool bVar4;
  shared_ptr<chrono::ChMarker> sVar5;
  
  plVar3 = *(long **)(CONCAT44(in_register_00000034,markID) + 0x78);
  plVar1 = *(long **)(CONCAT44(in_register_00000034,markID) + 0x80);
  bVar4 = plVar3 == plVar1;
  if (!bVar4) {
    myID = (int)in_RDX._M_pi;
    sVar5 = ChContainerSearchFromID<std::shared_ptr<chrono::ChMarker>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChMarker>const*,std::vector<std::shared_ptr<chrono::ChMarker>,std::allocator<std::shared_ptr<chrono::ChMarker>>>>>
                      ((chrono *)this,myID,*(shared_ptr<chrono::ChMarker> **)(*plVar3 + 0x1b0),
                       *(shared_ptr<chrono::ChMarker> **)(*plVar3 + 0x1b8));
    in_RDX = sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    pp_Var2 = (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    while (pp_Var2 == (_func_int **)0x0) {
      plVar3 = plVar3 + 2;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        in_RDX._M_pi = extraout_RDX;
      }
      bVar4 = plVar3 == plVar1;
      if (bVar4) goto LAB_0054a733;
      sVar5 = ChContainerSearchFromID<std::shared_ptr<chrono::ChMarker>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChMarker>const*,std::vector<std::shared_ptr<chrono::ChMarker>,std::allocator<std::shared_ptr<chrono::ChMarker>>>>>
                        ((chrono *)this,myID,*(shared_ptr<chrono::ChMarker> **)(*plVar3 + 0x1b0),
                         *(shared_ptr<chrono::ChMarker> **)(*plVar3 + 0x1b8));
      in_RDX = sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      pp_Var2 = (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    }
    if (!bVar4) goto LAB_0054a73b;
  }
LAB_0054a733:
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)0x0;
  (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p = (pointer)0x0;
LAB_0054a73b:
  sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChMarker>)
         sVar5.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChMarker> ChAssembly::SearchMarker(int markID) {
    // Iterate over all bodies and search in the body's marker list
    for (auto& body : bodylist) {
        if (auto res = ChContainerSearchFromID<std::shared_ptr<ChMarker>,
                                               std::vector<std::shared_ptr<ChMarker>>::const_iterator>(
                markID, body->GetMarkerList().begin(), body->GetMarkerList().end()))
            return res;
    }

    return (std::shared_ptr<ChMarker>());  // not found; return an empty shared_ptr
}